

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

void __thiscall
wasm::SuffixTreeTest_TestSingleCharacterRepeat_Test::~SuffixTreeTest_TestSingleCharacterRepeat_Test
          (SuffixTreeTest_TestSingleCharacterRepeat_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SuffixTreeTest, TestSingleCharacterRepeat) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 1, 1, 1, 1, 1, 2};
  std::vector<unsigned>::iterator RRDIt, RRDIt2;
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 1u);
  for (SuffixTree::RepeatedSubstring& RS : SubStrings) {
    EXPECT_EQ(RS.StartIndices.size(),
              RepeatedRepetitionData.size() - RS.Length);
    for (unsigned StartIdx : SubStrings[0].StartIndices) {
      RRDIt = RRDIt2 = RepeatedRepetitionData.begin();
      std::advance(RRDIt, StartIdx);
      std::advance(RRDIt2, StartIdx + SubStrings[0].Length);
      ASSERT_TRUE(
        all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2),
               [](unsigned Elt) { return Elt == 1; }));
    }
  }
}